

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

Vec_Ptr_t * Cec_ManPatCollectPatterns(Cec_ManPat_t *pMan,int nInputs,int nWordsInit)

{
  int iVar1;
  Vec_Int_t *vPat_00;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *vInfo_00;
  Vec_Ptr_t *vInfo_01;
  int *pLits;
  abctime aVar5;
  abctime clk;
  int nBits;
  int nWords;
  int iStartOld;
  int nPatterns;
  int kMax;
  int k;
  Vec_Ptr_t *vPres;
  Vec_Ptr_t *vInfo;
  Vec_Int_t *vPat;
  int nWordsInit_local;
  int nInputs_local;
  Cec_ManPat_t *pMan_local;
  
  vPat_00 = pMan->vPattern1;
  iStartOld = -1;
  nWords = 0;
  iVar1 = pMan->iStart;
  clk._0_4_ = nWordsInit << 5;
  aVar4 = Abc_Clock();
  vInfo_00 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Gia_ManRandomInfo(vInfo_00,0,0,nWordsInit);
  vInfo_01 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Vec_PtrCleanSimInfo(vInfo_01,0,nWordsInit);
  clk._4_4_ = nWordsInit;
  do {
    iVar3 = pMan->iStart;
    iVar2 = Vec_StrSize(pMan->vStorage);
    if (iVar2 <= iVar3) {
      Vec_PtrFree(vInfo_01);
      iVar3 = Vec_PtrReadWordsSimInfo(vInfo_00);
      pMan->nSeries = iVar3 / nWordsInit;
      aVar5 = Abc_Clock();
      pMan->timePack = (aVar5 - aVar4) + pMan->timePack;
      aVar5 = Abc_Clock();
      pMan->timeTotal = (aVar5 - aVar4) + pMan->timeTotal;
      pMan->iStart = iVar1;
      if (pMan->fVerbose != 0) {
        Abc_Print(1,"Total = %5d. Max used = %5d. Full = %5d. Series = %d. ",(ulong)(uint)nWords,
                  (ulong)(uint)iStartOld,(ulong)(uint)(nWordsInit << 5),(ulong)(uint)pMan->nSeries);
        Abc_Print(1,"%s =","Time");
        aVar5 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
        Cec_ManPatPrintStats(pMan);
      }
      return vInfo_00;
    }
    nWords = nWords + 1;
    Cec_ManPatRestore(pMan,vPat_00);
    for (nPatterns = 1; nPatterns < (int)clk;
        nPatterns = (uint)((nPatterns + 1) % (nWordsInit << 5) == 0) + nPatterns + 1) {
      pLits = Vec_IntArray(vPat_00);
      iVar3 = Vec_IntSize(vPat_00);
      iVar3 = Cec_ManPatCollectTry(vInfo_00,vInfo_01,nPatterns,pLits,iVar3);
      if (iVar3 != 0) break;
    }
    iStartOld = Abc_MaxInt(iStartOld,nPatterns);
    if (nPatterns == (int)clk + -1) {
      Vec_PtrReallocSimInfo(vInfo_00);
      Gia_ManRandomInfo(vInfo_00,0,clk._4_4_,clk._4_4_ << 1);
      Vec_PtrReallocSimInfo(vInfo_01);
      Vec_PtrCleanSimInfo(vInfo_01,clk._4_4_,clk._4_4_ << 1);
      clk._4_4_ = clk._4_4_ << 1;
      clk._0_4_ = (int)clk << 1;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatCollectPatterns( Cec_ManPat_t *  pMan, int nInputs, int nWordsInit )
{
    Vec_Int_t * vPat = pMan->vPattern1;
    Vec_Ptr_t * vInfo, * vPres;
    int k, kMax = -1, nPatterns = 0;
    int iStartOld = pMan->iStart;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
    abctime clk = Abc_Clock();
    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Gia_ManRandomInfo( vInfo, 0, 0, nWords );
    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( pMan->iStart < Vec_StrSize(pMan->vStorage) )
    {
        nPatterns++;
        Cec_ManPatRestore( pMan, vPat );
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Gia_ManRandomInfo( vInfo, 0, nWords, 2*nWords );
            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
    Vec_PtrFree( vPres );
    pMan->nSeries = Vec_PtrReadWordsSimInfo(vInfo) / nWordsInit;
    pMan->timePack += Abc_Clock() - clk;
    pMan->timeTotal += Abc_Clock() - clk;
    pMan->iStart = iStartOld;
    if ( pMan->fVerbose )
    {
        Abc_Print( 1, "Total = %5d. Max used = %5d. Full = %5d. Series = %d. ", 
            nPatterns, kMax, nWordsInit*32, pMan->nSeries );
        ABC_PRT( "Time", Abc_Clock() - clk );
        Cec_ManPatPrintStats( pMan );
    }
    return vInfo;
}